

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O0

void __thiscall StreamSummary<4U>::StreamSummary(StreamSummary<4U> *this,uint32_t _SIZE)

{
  void *pvVar1;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  count_type in_stack_ffffffffffffffbc;
  StreamBucket *this_00;
  
  *in_RDI = in_ESI;
  this_00 = (StreamBucket *)(in_RDI + 2);
  std::
  unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
  ::unordered_map((unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
                   *)0x11663b);
  pvVar1 = operator_new(0x20);
  StreamBucket::StreamBucket(this_00,in_stack_ffffffffffffffbc);
  *(void **)(in_RDI + 0x10) = pvVar1;
  return;
}

Assistant:

StreamSummary(uint32_t _SIZE) : SIZE(_SIZE), min_bucket(new StreamBucket()) {}